

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int64_t advance_file_pointer(archive_read_filter *filter,int64_t request)

{
  int iVar1;
  long lVar2;
  archive_read_filter *in_RSI;
  long *in_RDI;
  size_t min;
  ssize_t bytes_read;
  int64_t total_bytes_skipped;
  int64_t bytes_skipped;
  archive_read_filter *local_48;
  archive_read_filter *local_40;
  archive_read_filter *local_18;
  archive_read_filter *local_8;
  
  local_40 = (archive_read_filter *)0x0;
  if (*(char *)((long)in_RDI + 0xaa) == '\0') {
    local_18 = in_RSI;
    if (in_RDI[0x10] != 0) {
      local_40 = in_RSI;
      if (in_RDI[0x10] <= (long)in_RSI) {
        local_40 = (archive_read_filter *)in_RDI[0x10];
      }
      in_RDI[0xf] = (long)&local_40->position + in_RDI[0xf];
      in_RDI[0x10] = in_RDI[0x10] - (long)local_40;
      local_18 = (archive_read_filter *)((long)in_RSI - (long)local_40);
      *in_RDI = (long)&local_40->position + *in_RDI;
    }
    if (in_RDI[0x14] != 0) {
      if ((long)local_18 < in_RDI[0x14]) {
        local_48 = local_18;
      }
      else {
        local_48 = (archive_read_filter *)in_RDI[0x14];
      }
      in_RDI[0x13] = (long)&local_48->position + in_RDI[0x13];
      in_RDI[0x14] = in_RDI[0x14] - (long)local_48;
      local_18 = (archive_read_filter *)((long)local_18 - (long)local_48);
      *in_RDI = (long)&local_48->position + *in_RDI;
      local_40 = (archive_read_filter *)((long)&local_40->position + (long)&local_48->position);
    }
    local_8 = local_40;
    if (local_18 != (archive_read_filter *)0x0) {
      if (in_RDI[6] != 0) {
        lVar2 = (*(code *)in_RDI[6])(in_RDI,local_18);
        if (lVar2 < 0) {
          *(undefined1 *)((long)in_RDI + 0xaa) = 1;
          return lVar2;
        }
        *in_RDI = lVar2 + *in_RDI;
        local_40 = (archive_read_filter *)((long)&local_40->position + lVar2);
        local_18 = (archive_read_filter *)((long)local_18 - lVar2);
        if (local_18 == (archive_read_filter *)0x0) {
          return (int64_t)local_40;
        }
      }
      do {
        while( true ) {
          lVar2 = (*(code *)in_RDI[5])(in_RDI,in_RDI + 0x11);
          if (lVar2 < 0) {
            in_RDI[0x11] = 0;
            *(undefined1 *)((long)in_RDI + 0xaa) = 1;
            return lVar2;
          }
          if (lVar2 == 0) break;
          if ((long)local_18 <= lVar2) {
            in_RDI[0x13] = (long)&local_18->position + in_RDI[0x11];
            in_RDI[0x14] = lVar2 - (long)local_18;
            in_RDI[0x12] = lVar2;
            *in_RDI = (long)&local_18->position + *in_RDI;
            return (long)&local_40->position + (long)&local_18->position;
          }
          *in_RDI = lVar2 + *in_RDI;
          local_40 = (archive_read_filter *)((long)&local_40->position + lVar2);
          local_18 = (archive_read_filter *)((long)local_18 - lVar2);
        }
      } while ((*(int *)(in_RDI[3] + 0xf4) != *(int *)(in_RDI[3] + 0xf0) + -1) &&
              (iVar1 = client_switch_proxy(local_40,0), iVar1 == 0));
      in_RDI[0x11] = 0;
      *(undefined1 *)(in_RDI + 0x15) = 1;
      local_8 = local_40;
    }
  }
  else {
    local_8 = (archive_read_filter *)0xffffffffffffffff;
  }
  return (int64_t)local_8;
}

Assistant:

static int64_t
advance_file_pointer(struct archive_read_filter *filter, int64_t request)
{
	int64_t bytes_skipped, total_bytes_skipped = 0;
	ssize_t bytes_read;
	size_t min;

	if (filter->fatal)
		return (-1);

	/* Use up the copy buffer first. */
	if (filter->avail > 0) {
		min = (size_t)minimum(request, (int64_t)filter->avail);
		filter->next += min;
		filter->avail -= min;
		request -= min;
		filter->position += min;
		total_bytes_skipped += min;
	}

	/* Then use up the client buffer. */
	if (filter->client_avail > 0) {
		min = (size_t)minimum(request, (int64_t)filter->client_avail);
		filter->client_next += min;
		filter->client_avail -= min;
		request -= min;
		filter->position += min;
		total_bytes_skipped += min;
	}
	if (request == 0)
		return (total_bytes_skipped);

	/* If there's an optimized skip function, use it. */
	if (filter->skip != NULL) {
		bytes_skipped = (filter->skip)(filter, request);
		if (bytes_skipped < 0) {	/* error */
			filter->fatal = 1;
			return (bytes_skipped);
		}
		filter->position += bytes_skipped;
		total_bytes_skipped += bytes_skipped;
		request -= bytes_skipped;
		if (request == 0)
			return (total_bytes_skipped);
	}

	/* Use ordinary reads as necessary to complete the request. */
	for (;;) {
		bytes_read = (filter->read)(filter, &filter->client_buff);
		if (bytes_read < 0) {
			filter->client_buff = NULL;
			filter->fatal = 1;
			return (bytes_read);
		}

		if (bytes_read == 0) {
			if (filter->archive->client.cursor !=
			      filter->archive->client.nodes - 1) {
				if (client_switch_proxy(filter,
				    filter->archive->client.cursor + 1)
				    == ARCHIVE_OK)
					continue;
			}
			filter->client_buff = NULL;
			filter->end_of_file = 1;
			return (total_bytes_skipped);
		}

		if (bytes_read >= request) {
			filter->client_next =
			    ((const char *)filter->client_buff) + request;
			filter->client_avail = (size_t)(bytes_read - request);
			filter->client_total = bytes_read;
			total_bytes_skipped += request;
			filter->position += request;
			return (total_bytes_skipped);
		}

		filter->position += bytes_read;
		total_bytes_skipped += bytes_read;
		request -= bytes_read;
	}
}